

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O3

int M_ReadFile(char *name,BYTE **buffer)

{
  int __fd;
  int iVar1;
  BYTE *__buf;
  ssize_t sVar2;
  stat fileinfo;
  stat local_c0;
  
  __fd = open(name,0,0x1b6);
  if (__fd == -1) {
    I_Error("Couldn\'t read file %s",name);
  }
  iVar1 = stat(name,&local_c0);
  if (iVar1 == -1) {
    I_Error("Couldn\'t read file %s",name);
  }
  __buf = (BYTE *)operator_new__((long)(int)local_c0.st_size);
  sVar2 = read(__fd,__buf,(long)(int)local_c0.st_size);
  close(__fd);
  if ((int)sVar2 < (int)local_c0.st_size) {
    I_Error("Couldn\'t read file %s",name);
  }
  *buffer = __buf;
  return (int)local_c0.st_size;
}

Assistant:

int M_ReadFile (char const *name, BYTE **buffer)
{
	int handle, count, length;
	struct stat fileinfo;
	BYTE *buf;

	handle = open (name, O_RDONLY | O_BINARY, 0666);
	if (handle == -1)
		I_Error ("Couldn't read file %s", name);
	// [BL] Use stat instead of fstat for v140_xp hack
	if (stat (name,&fileinfo) == -1)
		I_Error ("Couldn't read file %s", name);
	length = fileinfo.st_size;
	buf = new BYTE[length];
	count = read (handle, buf, length);
	close (handle);

	if (count < length)
		I_Error ("Couldn't read file %s", name);

	*buffer = buf;
	return length;
}